

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O0

Dictionary * ASDCP::AtmosSMPTEDict(void)

{
  MDDEntry *pMVar1;
  AutoMutex local_10;
  AutoMutex AL;
  
  if (!s_AtmosSMPTEDictInit) {
    Kumu::AutoMutex::AutoMutex(&local_10,&s_AtmosSMPTEDictLock);
    if ((s_AtmosSMPTEDictInit & 1U) == 0) {
      Dictionary::Init(&s_AtmosSMPTEDict);
      Dictionary::DeleteEntry(&s_AtmosSMPTEDict,1);
      Dictionary::DeleteEntry(&s_AtmosSMPTEDict,0xe);
      Dictionary::DeleteEntry(&s_AtmosSMPTEDict,0x110);
      pMVar1 = Dictionary::Type(&s_AtmosSMPTEDict,MDD_GenericDataEssenceDescriptor_DataEssenceCoding
                               );
      if (pMVar1->ul[7] != '\x03') {
        __assert_fail("s_AtmosSMPTEDict.Type(MDD_GenericDataEssenceDescriptor_DataEssenceCoding).ul[7] == 0x03"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                      ,0xa2,"const ASDCP::Dictionary &ASDCP::AtmosSMPTEDict()");
      }
      pMVar1 = Dictionary::MutableType
                         (&s_AtmosSMPTEDict,MDD_GenericDataEssenceDescriptor_DataEssenceCoding);
      pMVar1->ul[7] = '\x05';
      s_AtmosSMPTEDictInit = true;
    }
    Kumu::AutoMutex::~AutoMutex(&local_10);
  }
  return &s_AtmosSMPTEDict;
}

Assistant:

const ASDCP::Dictionary&
ASDCP::AtmosSMPTEDict()
{
  if ( ! s_AtmosSMPTEDictInit )
    {
      Kumu::AutoMutex AL(s_AtmosSMPTEDictLock);

      if ( ! s_AtmosSMPTEDictInit )
	{
	  s_AtmosSMPTEDict.Init();

	  s_AtmosSMPTEDict.DeleteEntry(MDD_MXFInterop_OPAtom);
	  s_AtmosSMPTEDict.DeleteEntry(MDD_MXFInterop_CryptEssence);
	  s_AtmosSMPTEDict.DeleteEntry(MDD_MXFInterop_GenericDescriptor_SubDescriptors);

	  // legacy Atmos files have the wrong version byte
	  assert(s_AtmosSMPTEDict.Type(MDD_GenericDataEssenceDescriptor_DataEssenceCoding).ul[7] == 0x03);
	  s_AtmosSMPTEDict.MutableType(MDD_GenericDataEssenceDescriptor_DataEssenceCoding).ul[7] = 0x05;
	  
	  s_AtmosSMPTEDictInit = true;
	}
    }

  return s_AtmosSMPTEDict;
}